

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTPSTRDec(char *val,size_t *len,octet *der,size_t count,u32 tag)

{
  char cVar1;
  char *pcVar2;
  undefined8 *in_RSI;
  long in_RDI;
  char ch;
  size_t pos;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  octet *in_stack_ffffffffffffffb8;
  size_t *psVar3;
  size_t *in_stack_ffffffffffffffc0;
  octet **in_stack_ffffffffffffffc8;
  size_t local_8;
  
  local_8 = derDec2(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    for (psVar3 = (size_t *)0x0; psVar3 < in_stack_ffffffffffffffc0;
        psVar3 = (size_t *)((long)psVar3 + 1)) {
      cVar1 = *(char *)((long)in_stack_ffffffffffffffc8 + (long)psVar3);
      if ((((cVar1 < '0') || ('9' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
         (((cVar1 < 'a' || ('z' < cVar1)) &&
          (pcVar2 = strchr(" \'()+,-./:=?",(int)cVar1), pcVar2 == (char *)0x0)))) {
        return 0xffffffffffffffff;
      }
      in_stack_ffffffffffffffb7 = 0;
    }
    if (in_RDI != 0) {
      memMove((void *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x118cf7);
      *(undefined1 *)(in_RDI + (long)in_stack_ffffffffffffffc0) = 0;
    }
    if (in_RSI != (undefined8 *)0x0) {
      *in_RSI = in_stack_ffffffffffffffc0;
    }
  }
  return local_8;
}

Assistant:

size_t derTPSTRDec(char* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t pos;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// проверить символы (см. strIsPrintable())
	for (pos = 0; pos < l; ++pos)
	{
		register char ch = (char)v[pos];
		if ((ch < '0' || ch > '9') &&
			(ch < 'A' || ch > 'Z') &&
			(ch < 'a' || ch > 'z') &&
			strchr(" '()+,-./:=?", ch) == 0)
		{
			ch = 0;
			return SIZE_MAX;
		}
		ch = 0;
	}
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l + 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l + 1));
		memMove(val, v, l);
		val[l] = 0;
	}
	// возвратить длину строки
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}